

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_tbar(ASMState *as,IRIns *ir)

{
  MCLabel target;
  MCode *pMVar1;
  Reg rb;
  Reg RVar2;
  MCLabel l_end;
  Reg tmp;
  Reg tab;
  IRIns *ir_local;
  ASMState *as_local;
  
  rb = ra_alloc1(as,(uint)(ir->field_0).op1,0xbfef);
  RVar2 = ra_scratch(as,(1 << ((byte)rb & 0x1f) ^ 0xffffffffU) & 0xbfef);
  target = as->mcp;
  emit_rmro(as,XO_MOVto,RVar2 | 0x80200,rb,0x18);
  emit_rma(as,XO_MOVto,rb | 0x80200,&as->J[-1].penalty[0x28].val);
  emit_rma(as,XO_MOV,RVar2 | 0x80200,&as->J[-1].penalty[0x28].val);
  pMVar1 = as->mcp;
  as->mcp = pMVar1 + -1;
  pMVar1[-1] = 0xfb;
  emit_rmro(as,XO_ARITHib,4,rb,8);
  emit_sjcc(as,4,target);
  pMVar1 = as->mcp;
  as->mcp = pMVar1 + -1;
  pMVar1[-1] = '\x04';
  emit_rmro(as,XO_GROUP3b,0,rb,8);
  return;
}

Assistant:

static void asm_tbar(ASMState *as, IRIns *ir)
{
  Reg tab = ra_alloc1(as, ir->op1, RSET_GPR);
  Reg tmp = ra_scratch(as, rset_exclude(RSET_GPR, tab));
  MCLabel l_end = emit_label(as);
  emit_movtomro(as, tmp|REX_GC64, tab, offsetof(GCtab, gclist));
  emit_setgl(as, tab, gc.grayagain);
  emit_getgl(as, tmp, gc.grayagain);
  emit_i8(as, ~LJ_GC_BLACK);
  emit_rmro(as, XO_ARITHib, XOg_AND, tab, offsetof(GCtab, marked));
  emit_sjcc(as, CC_Z, l_end);
  emit_i8(as, LJ_GC_BLACK);
  emit_rmro(as, XO_GROUP3b, XOg_TEST, tab, offsetof(GCtab, marked));
}